

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_socket.cpp
# Opt level: O2

int GetHostByAddr(uchar *Address,char *szName)

{
  int iVar1;
  hostent *phVar2;
  
  phVar2 = gethostbyaddr(Address,4,2);
  if (phVar2 == (hostent *)0x0) {
    LogMessage(1,"Unable to get CortexHost name information");
    iVar1 = 3;
  }
  else {
    strcpy(szName,phVar2->h_name);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int GetHostByAddr(unsigned char Address[4], char *szName)
{
    hostent* pHostEnt;

    pHostEnt = gethostbyaddr((char*)Address, 4, PF_INET);

    if (pHostEnt == NULL)
    {
        LogMessage(VL_Error, "Unable to get CortexHost name information");
        return RC_NetworkError;
    }
    strcpy(szName, pHostEnt->h_name);

    return RC_Okay;
}